

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O3

void gc_twist_tf_ref_to_tgt(gc_pose *x,gc_twist *xd,gc_twist *r)

{
  vector3 v_rxw;
  vector3 rxw;
  
  if (x == (gc_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,99,
                  "void gc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_twist *, struct gc_twist *)"
                 );
  }
  if (xd == (gc_twist *)0x0) {
    __assert_fail("xd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,100,
                  "void gc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_twist *, struct gc_twist *)"
                 );
  }
  if (r == (gc_twist *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x65,
                  "void gc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_twist *, struct gc_twist *)"
                 );
  }
  if (xd != r) {
    la_dcross_o((double *)x->translation,1,(double *)xd->angular_velocity,1,(double *)&rxw,1);
    la_daxpy_oe(3,-1.0,(double *)&rxw,1,(double *)xd->linear_velocity,1,(double *)&v_rxw,1);
    la_dgemv_nos(3,3,(double *)x->rotation,3,(double *)xd->angular_velocity,1,
                 (double *)r->angular_velocity,1);
    la_dgemv_nos(3,3,(double *)x->rotation,3,(double *)&v_rxw,1,(double *)r->linear_velocity,1);
    return;
  }
  __assert_fail("xd != r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x66,
                "void gc_twist_tf_ref_to_tgt(const struct gc_pose *, const struct gc_twist *, struct gc_twist *)"
               );
}

Assistant:

void gc_twist_tf_ref_to_tgt(
        const struct gc_pose *x,
        const struct gc_twist *xd,
        struct gc_twist *r)
{
    assert(x);
    assert(xd);
    assert(r);
    assert(xd != r);

    // r x w
    struct vector3 rxw;
    la_dcross_o((double *)x->translation, 1,
            (double *)xd->angular_velocity, 1,
            (double *)&rxw, 1);

    // v - r x w
    struct vector3 v_rxw;
    la_daxpy_oe(3,
            -1.0, (double *)&rxw, 1,
            (double *)xd->linear_velocity, 1,
            (double *)&v_rxw, 1);

    // v' = E(v - r x w)
    la_dgemv_nos(3, 3,
            (double *)x->rotation, 3,
            (double *)xd->angular_velocity, 1,
            (double *)r->angular_velocity, 1);

    // w' = E w
    la_dgemv_nos(3, 3,
            (double *)x->rotation, 3,
            (double *)&v_rxw, 1,
            (double *)r->linear_velocity, 1);
}